

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_start_domain2(mg_context *ctx,char **options,mg_error_data *error)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  mg_domain_context *pmVar4;
  int iVar5;
  mg_domain_context *__ptr;
  size_t sVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  __int32_t **pp_Var9;
  uint uVar10;
  undefined8 in_RCX;
  undefined8 uVar11;
  size_t sVar12;
  char *extraout_RDX;
  char *func;
  mg_context *ctx_00;
  char *extraout_RDX_00;
  mg_context *ctx_01;
  int i;
  uint uVar13;
  long lVar14;
  mg_domain_context *pmVar15;
  mg_option *pmVar16;
  char *pcVar17;
  char *fmt;
  char *pcVar18;
  
  if ((error != (mg_error_data *)0x0) &&
     (error->code = 0, error->code_sub = 0, error->text_buffer_size != 0)) {
    *error->text = '\0';
  }
  uVar11 = CONCAT71((int7)((ulong)in_RCX >> 8),options != (char **)0x0);
  if (ctx != (mg_context *)0x0 && options != (char **)0x0) {
    if (ctx->stop_flag == 0) {
      __ptr = (mg_domain_context *)calloc(1,0x200);
      uVar10 = (uint)uVar11;
      if (__ptr != (mg_domain_context *)0x0) {
        pcVar17 = extraout_RDX;
        if (options != (char **)0x0) {
          pcVar18 = *options;
          while (pcVar18 != (char *)0x0) {
            pmVar16 = config_options;
            lVar14 = 0;
            pcVar17 = "listening_ports";
            do {
              pmVar16 = pmVar16 + 1;
              iVar5 = strcmp(pcVar17,pcVar18);
              if (iVar5 == 0) goto LAB_00118269;
              lVar14 = lVar14 + 1;
              pcVar17 = pmVar16->name;
            } while (lVar14 != 0x3a);
            lVar14 = 0xffffffff;
LAB_00118269:
            uVar13 = (uint)lVar14;
            uVar10 = (uint)uVar11;
            if (uVar13 == 0xffffffff) {
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,ctx,func,uVar10,"Invalid option: %s",pcVar18);
              if (error == (mg_error_data *)0x0) goto LAB_0011856e;
              error->code = 2;
              error->code_sub = 0xffffffff;
              pcVar17 = error->text;
              sVar12 = error->text_buffer_size;
              fmt = "Invalid option: %s";
LAB_00118560:
              mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar17,sVar12,fmt,pcVar18);
LAB_0011856e:
              free(__ptr);
              return -2;
            }
            pcVar17 = options[1];
            if (pcVar17 == (char *)0x0) {
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,ctx,func,uVar10,"%s: option value cannot be NULL",
                         pcVar18);
              if (error == (mg_error_data *)0x0) goto LAB_0011856e;
              error->code = 2;
              error->code_sub = uVar13;
              pcVar17 = error->text;
              sVar12 = error->text_buffer_size;
              fmt = "Invalid option value: %s";
              goto LAB_00118560;
            }
            if (__ptr->config[(int)uVar13] != (char *)0x0) {
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,ctx,func,uVar10,"warning: %s: duplicate option",
                         pcVar18);
              free(__ptr->config[(int)uVar13]);
            }
            options = options + 2;
            sVar6 = strlen(pcVar17);
            pcVar17 = mg_strndup_ctx(pcVar17,sVar6,ctx_00);
            uVar10 = (uint)uVar11;
            __ptr->config[(int)uVar13] = pcVar17;
            pcVar17 = extraout_RDX_00;
            pcVar18 = *options;
          }
        }
        if (__ptr->config[0x1e] == (char *)0x0) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,ctx,pcVar17,uVar10,"%s","authentication domain required");
          if (error != (mg_error_data *)0x0) {
            error->code = 4;
            error->code_sub = 0x1e;
            mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                        "Mandatory option %s missing","authentication_domain");
          }
          free(__ptr);
          return -4;
        }
        lVar14 = 0;
        do {
          pcVar17 = (ctx->dd).config[lVar14];
          if (pcVar17 != (char *)0x0 && __ptr->config[lVar14] == (char *)0x0) {
            sVar6 = strlen(pcVar17);
            pcVar17 = mg_strndup_ctx(pcVar17,sVar6,ctx_01);
            __ptr->config[lVar14] = pcVar17;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x3a);
        __ptr->handlers = (mg_handler_info *)0x0;
        __ptr->nonce_count = 0;
        __ptr->next = (mg_domain_context *)0x0;
        uVar7 = get_random();
        uVar8 = get_random();
        __ptr->auth_nonce_mask = uVar8 << 0x1f ^ uVar7;
        if (ctx->context_type == 1) {
          pthread_mutex_lock((pthread_mutex_t *)&ctx->nonce_mutex);
        }
        pcVar17 = __ptr->config[0x1e];
        pp_Var9 = __ctype_tolower_loc();
        iVar5 = 0;
        pmVar4 = &ctx->dd;
        do {
          pmVar15 = pmVar4;
          lVar14 = 0;
          do {
            bVar1 = pcVar17[lVar14];
            iVar2 = (*pp_Var9)[bVar1];
            iVar3 = (*pp_Var9)[(byte)pmVar15->config[0x1e][lVar14]];
            if (bVar1 == 0) break;
            lVar14 = lVar14 + 1;
          } while (iVar2 == iVar3);
          if (iVar2 == iVar3) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,ctx,pmVar15->config[0x1e],(uint)pmVar15,
                       "domain %s already in use",pcVar17);
            if (error != (mg_error_data *)0x0) {
              error->code = 5;
              mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                          "Domain %s specified by %s is already in use",__ptr->config[0x1e],
                          "authentication_domain");
            }
            free(__ptr);
            iVar5 = -5;
            goto LAB_001184cf;
          }
          iVar5 = iVar5 + 1;
          pmVar4 = pmVar15->next;
          if (pmVar15->next == (mg_domain_context *)0x0) {
            pmVar15->next = __ptr;
LAB_001184cf:
            if (ctx->context_type != 1) {
              return iVar5;
            }
            pthread_mutex_unlock((pthread_mutex_t *)&ctx->nonce_mutex);
            return iVar5;
          }
        } while( true );
      }
      iVar5 = -6;
      if (error == (mg_error_data *)0x0) {
        return -6;
      }
      error->code = 6;
      error->code_sub = 0x200;
      pcVar17 = error->text;
      sVar12 = error->text_buffer_size;
      pcVar18 = "Out or memory";
    }
    else {
      iVar5 = -7;
      if (error == (mg_error_data *)0x0) {
        return -7;
      }
      error->code = 7;
      pcVar17 = error->text;
      sVar12 = error->text_buffer_size;
      pcVar18 = "Server already stopped";
    }
  }
  else {
    iVar5 = -1;
    if (error == (mg_error_data *)0x0) {
      return -1;
    }
    error->code = 1;
    pcVar17 = error->text;
    sVar12 = error->text_buffer_size;
    pcVar18 = "Invalid parameters";
  }
  mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar17,sVar12,"%s",pcVar18);
  return iVar5;
}

Assistant:

CIVETWEB_API int
mg_start_domain2(struct mg_context *ctx,
                 const char **options,
                 struct mg_error_data *error)
{
	const char *name;
	const char *value;
	const char *default_value;
	struct mg_domain_context *new_dom;
	struct mg_domain_context *dom;
	int idx, i;

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			*error->text = 0;
		}
	}

	if ((ctx == NULL) || (options == NULL)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_PARAM;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Invalid parameters");
		}
		return -1;
	}

	if (!STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_SERVER_STOPPED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Server already stopped");
		}
		return -7;
	}

	new_dom = (struct mg_domain_context *)
	    mg_calloc_ctx(1, sizeof(struct mg_domain_context), ctx);

	if (!new_dom) {
		/* Out of memory */
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)sizeof(struct mg_domain_context);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Out or memory");
		}
		return -6;
	}

	/* Store options - TODO: unite duplicate code */
	while (options && (name = *options++) != NULL) {
		idx = get_option_index(name);
		if (idx == -1) {
			mg_cry_ctx_internal(ctx, "Invalid option: %s", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)-1;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid option: %s",
				            name);
			}
			mg_free(new_dom);
			return -2;
		} else if ((value = *options++) == NULL) {
			mg_cry_ctx_internal(ctx, "%s: option value cannot be NULL", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)idx;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid option value: %s",
				            name);
			}
			mg_free(new_dom);
			return -2;
		}
		if (new_dom->config[idx] != NULL) {
			/* Duplicate option: Later values overwrite earlier ones. */
			mg_cry_ctx_internal(ctx, "warning: %s: duplicate option", name);
			mg_free(new_dom->config[idx]);
		}
		new_dom->config[idx] = mg_strdup_ctx(value, ctx);
		DEBUG_TRACE("[%s] -> [%s]", name, value);
	}

	/* Authentication domain is mandatory */
	/* TODO: Maybe use a new option hostname? */
	if (!new_dom->config[AUTHENTICATION_DOMAIN]) {
		mg_cry_ctx_internal(ctx, "%s", "authentication domain required");
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_MISSING_OPTION;
			error->code_sub = AUTHENTICATION_DOMAIN;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Mandatory option %s missing",
			            config_options[AUTHENTICATION_DOMAIN].name);
		}
		mg_free(new_dom);
		return -4;
	}

	/* Set default value if needed. Take the config value from
	 * ctx as a default value. */
	for (i = 0; config_options[i].name != NULL; i++) {
		default_value = ctx->dd.config[i];
		if ((new_dom->config[i] == NULL) && (default_value != NULL)) {
			new_dom->config[i] = mg_strdup_ctx(default_value, ctx);
		}
	}

	new_dom->handlers = NULL;
	new_dom->next = NULL;
	new_dom->nonce_count = 0;
	new_dom->auth_nonce_mask = get_random() ^ (get_random() << 31);

#if defined(USE_LUA) && defined(USE_WEBSOCKET)
	new_dom->shared_lua_websockets = NULL;
#endif

#if !defined(NO_SSL) && !defined(USE_MBEDTLS)
	if (!init_ssl_ctx(ctx, new_dom)) {
		/* Init SSL failed */
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Initializing SSL context failed");
		}
		mg_free(new_dom);
		return -3;
	}
#endif

	/* Add element to linked list. */
	mg_lock_context(ctx);

	idx = 0;
	dom = &(ctx->dd);
	for (;;) {
		if (!mg_strcasecmp(new_dom->config[AUTHENTICATION_DOMAIN],
		                   dom->config[AUTHENTICATION_DOMAIN])) {
			/* Domain collision */
			mg_cry_ctx_internal(ctx,
			                    "domain %s already in use",
			                    new_dom->config[AUTHENTICATION_DOMAIN]);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_DUPLICATE_DOMAIN;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Domain %s specified by %s is already in use",
				            new_dom->config[AUTHENTICATION_DOMAIN],
				            config_options[AUTHENTICATION_DOMAIN].name);
			}
			mg_free(new_dom);
			mg_unlock_context(ctx);
			return -5;
		}

		/* Count number of domains */
		idx++;

		if (dom->next == NULL) {
			dom->next = new_dom;
			break;
		}
		dom = dom->next;
	}

	mg_unlock_context(ctx);

	/* Return domain number */
	return idx;
}